

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.c
# Opt level: O1

void read_route(route_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  route_type_t rVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  route_t *__dest;
  
  record->id[0] = '\0';
  record->agency_id[0] = '\0';
  record->short_name[0] = '\0';
  record->long_name[0] = '\0';
  record->desc[0] = '\0';
  record->type = RT_NOT_SET;
  record->url[0] = '\0';
  record->color[0] = '\0';
  record->text_color[0] = '\0';
  record->sort_order = 0;
  if (0 < field_count) {
    uVar4 = 0;
    do {
      pcVar5 = field_names[uVar4];
      iVar1 = strcmp(pcVar5,"route_id");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar4];
        __dest = record;
LAB_00106a38:
        strcpy(__dest->id,pcVar5);
      }
      else {
        iVar1 = strcmp(pcVar5,"agency_id");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (route_t *)record->agency_id;
          goto LAB_00106a38;
        }
        iVar1 = strcmp(pcVar5,"route_short_name");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (route_t *)record->short_name;
          goto LAB_00106a38;
        }
        iVar1 = strcmp(pcVar5,"route_long_name");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (route_t *)record->long_name;
          goto LAB_00106a38;
        }
        iVar1 = strcmp(pcVar5,"route_desc");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (route_t *)record->desc;
          goto LAB_00106a38;
        }
        iVar1 = strcmp(pcVar5,"route_type");
        if (iVar1 != 0) {
          iVar1 = strcmp(pcVar5,"route_url");
          if (iVar1 == 0) {
            pcVar5 = field_values[uVar4];
            __dest = (route_t *)record->url;
          }
          else {
            iVar1 = strcmp(pcVar5,"route_color");
            if (iVar1 == 0) {
              pcVar5 = field_values[uVar4];
              __dest = (route_t *)record->color;
            }
            else {
              iVar1 = strcmp(pcVar5,"route_text_color");
              if (iVar1 != 0) {
                iVar1 = strcmp(pcVar5,"route_sort_order");
                if (iVar1 == 0) {
                  lVar3 = strtol(field_values[uVar4],(char **)0x0,0);
                  record->sort_order = (int)lVar3;
                }
                goto LAB_00106a3d;
              }
              pcVar5 = field_values[uVar4];
              __dest = (route_t *)record->text_color;
            }
          }
          goto LAB_00106a38;
        }
        rVar2 = parse_route_type(field_values[uVar4]);
        record->type = rVar2;
      }
LAB_00106a3d:
      uVar4 = uVar4 + 1;
    } while ((uint)field_count != uVar4);
  }
  return;
}

Assistant:

void read_route(route_t *record, int field_count, const char **field_names, const char **field_values) {
    init_route(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "route_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_id") == 0) {
            strcpy(record->agency_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_short_name") == 0) {
            strcpy(record->short_name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_long_name") == 0) {
            strcpy(record->long_name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_desc") == 0) {
            strcpy(record->desc, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_type") == 0) {
            record->type = parse_route_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_url") == 0) {
            strcpy(record->url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_color") == 0) {
            strcpy(record->color, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_text_color") == 0) {
            strcpy(record->text_color, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_sort_order") == 0) {
            record->sort_order = (int)strtol(field_values[i], NULL, 0);
            continue;
        }
    }
}